

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::make_csharp_string_literal
          (string *__return_storage_ptr__,t_netstd_generator *this,string *value)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  long lVar4;
  reference pcVar5;
  int *piVar6;
  ostream *poVar7;
  int local_1e8 [3];
  char local_1d9;
  int width;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  stringstream result;
  ostream local_1b0;
  allocator local_21;
  string *local_20;
  string *value_local;
  t_netstd_generator *this_local;
  
  local_20 = value;
  value_local = (string *)this;
  this_local = (t_netstd_generator *)__return_storage_ptr__;
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
    std::operator<<(&local_1b0,"\"");
    __end1._M_current = (char *)std::__cxx11::string::begin();
    _width = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&width), bVar1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      local_1d9 = *pcVar5;
      if ((local_1d9 < '\0') || ('\x1f' < local_1d9)) {
        if ((local_1d9 == '\\') || (local_1d9 == '\"')) {
          poVar7 = std::operator<<(&local_1b0,"\\");
          std::operator<<(poVar7,(int)local_1d9);
        }
        else {
          std::operator<<(&local_1b0,(int)local_1d9);
        }
      }
      else {
        local_1e8[1] = 1;
        local_1e8[0] = 4;
        piVar6 = std::max<int>(local_1e8 + 1,local_1e8);
        local_1e8[2] = *piVar6;
        poVar7 = std::operator<<(&local_1b0,"\\x");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
        _Var3 = std::setw(local_1e8[2]);
        poVar7 = std::operator<<(poVar7,_Var3);
        _Var2 = std::setfill<char>('0');
        poVar7 = std::operator<<(poVar7,_Var2._M_c);
        std::ostream::operator<<(poVar7,(int)local_1d9);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    std::operator<<(&local_1b0,"\"");
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::make_csharp_string_literal( string const& value)
{
  if (value.length() == 0) {
    return "";
  }

  std::stringstream result;
  result << "\"";
  for (signed char const c: value) {
    if( (c >= 0) && (c < 32)) {  // convert ctrl chars, but leave UTF-8 alone
      int width = std::max( (int)sizeof(c), 4);
      result << "\\x" << std::hex << std::setw(width) << std::setfill('0') << (int)c;
    } else if ((c == '\\') || (c == '"')) {
      result << "\\" << c;
    } else {
      result << c;   // anything else "as is"
    }
  }
  result << "\"";

  return result.str();
}